

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qheaderview_p.h
# Opt level: O0

void __thiscall
QHeaderViewPrivate::setHiddenSectionsFromBitVector
          (QHeaderViewPrivate *this,QBitArray *sectionHidden)

{
  bool bVar1;
  pointer pSVar2;
  long i_00;
  qsizetype qVar3;
  int i;
  SectionItem *sectionData;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  int iVar4;
  
  pSVar2 = QList<QHeaderViewPrivate::SectionItem>::data
                     ((QList<QHeaderViewPrivate::SectionItem> *)
                      CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  iVar4 = 0;
  while( true ) {
    i_00 = (long)iVar4;
    qVar3 = QBitArray::size((QBitArray *)CONCAT44(iVar4,in_stack_ffffffffffffffe0));
    if (qVar3 <= i_00) break;
    bVar1 = QBitArray::at((QBitArray *)CONCAT44(iVar4,in_stack_ffffffffffffffe0),i_00);
    *(uint *)(pSVar2 + iVar4) = *(uint *)(pSVar2 + iVar4) & 0xffefffff | (uint)bVar1 << 0x14;
    iVar4 = iVar4 + 1;
  }
  return;
}

Assistant:

void setHiddenSectionsFromBitVector(const QBitArray &sectionHidden) {
        SectionItem *sectionData = sectionItems.data();
        for (int i = 0; i < sectionHidden.size(); ++i)
            sectionData[i].isHidden = sectionHidden.at(i);
    }